

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O2

wchar_t uriComposeQueryExA(char *dest,UriQueryListA *queryList,wchar_t maxChars,
                          wchar_t *charsWritten,UriBool spaceToPlus,UriBool normalizeBreaks)

{
  wchar_t wVar1;
  
  if (queryList == (UriQueryListA *)0x0 || dest == (char *)0x0) {
    wVar1 = L'\x02';
  }
  else {
    if (L'\0' < maxChars) {
      wVar1 = uriComposeQueryEngineA
                        (dest,queryList,maxChars,charsWritten,(wchar_t *)0x0,spaceToPlus,
                         normalizeBreaks);
      return wVar1;
    }
    wVar1 = L'\x04';
  }
  return wVar1;
}

Assistant:

int URI_FUNC(ComposeQueryEx)(URI_CHAR * dest,
		const URI_TYPE(QueryList) * queryList, int maxChars, int * charsWritten,
		UriBool spaceToPlus, UriBool normalizeBreaks) {
	if ((dest == NULL) || (queryList == NULL)) {
		return URI_ERROR_NULL;
	}

	if (maxChars < 1) {
		return URI_ERROR_OUTPUT_TOO_LARGE;
	}

	return URI_FUNC(ComposeQueryEngine)(dest, queryList, maxChars,
			charsWritten, NULL, spaceToPlus, normalizeBreaks);
}